

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

void __thiscall cashew::JSPrinter::printIf(JSPrinter *this,Ref node)

{
  undefined8 *puVar1;
  bool bVar2;
  Ref local_20;
  Ref node_local;
  
  local_20.inst = node.inst;
  emit(this,"if");
  safeSpace(this);
  emit(this,'(');
  puVar1 = (undefined8 *)cashew::Ref::operator[]((uint)&local_20);
  print(this,(Value *)*puVar1);
  emit(this,')');
  space(this);
  puVar1 = (undefined8 *)cashew::Ref::operator[]((uint)&local_20);
  bVar2 = isBlock((Value *)*puVar1);
  if (bVar2) {
    puVar1 = (undefined8 *)cashew::Ref::operator[]((uint)&local_20);
    print(this,(Value *)*puVar1);
  }
  else {
    emit(this,'{');
    this->indent = this->indent + 1;
    newline(this);
    puVar1 = (undefined8 *)cashew::Ref::operator[]((uint)&local_20);
    print(this,(Value *)*puVar1);
    this->indent = this->indent + -1;
    newline(this);
    emit(this,'}');
  }
  bVar2 = ifHasElse(local_20);
  if (bVar2) {
    space(this);
    emit(this,"else");
    safeSpace(this);
    puVar1 = (undefined8 *)cashew::Ref::operator[]((uint)&local_20);
    bVar2 = isBlock((Value *)*puVar1);
    if (bVar2) {
      puVar1 = (undefined8 *)cashew::Ref::operator[]((uint)&local_20);
      print(this,(Value *)*puVar1);
    }
    else {
      emit(this,'{');
      this->indent = this->indent + 1;
      newline(this);
      puVar1 = (undefined8 *)cashew::Ref::operator[]((uint)&local_20);
      print(this,(Value *)*puVar1);
      this->indent = this->indent + -1;
      newline(this);
      emit(this,'}');
    }
  }
  return;
}

Assistant:

void printIf(Ref node) {
    emit("if");
    safeSpace();
    emit('(');
    print(node[1]);
    emit(')');
    space();
    bool emitsBracesAnyhow = isBlock(node[2]);
    if (!emitsBracesAnyhow) {
      emit('{');
      indent++;
      newline();
    }
    print(node[2]);
    if (!emitsBracesAnyhow) {
      indent--;
      newline();
      emit('}');
    }
    if (ifHasElse(node)) {
      space();
      emit("else");
      safeSpace();
      bool emitsBracesAnyhow = isBlock(node[3]);
      if (!emitsBracesAnyhow) {
        emit('{');
        indent++;
        newline();
      }
      print(node[3]);
      if (!emitsBracesAnyhow) {
        indent--;
        newline();
        emit('}');
      }
    }
  }